

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_info.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
BlockInfo::ToString(BlockInfo *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  DatanodeInfo *in_stack_ffffffffffffff98;
  undefined1 local_60 [8];
  unsigned_long_long in_stack_ffffffffffffffa8;
  undefined1 local_48 [4];
  int in_stack_ffffffffffffffbc;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  undefined1 local_18 [24];
  
  __lhs = in_RDI;
  std::to_string(in_stack_ffffffffffffffa8);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::to_string(in_stack_ffffffffffffffa8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  std::to_string(in_stack_ffffffffffffffbc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  DatanodeInfo::ToString(in_stack_ffffffffffffff98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::string::~string(&stack0xffffffffffffff90);
  std::string::~string(local_18);
  std::string::~string(local_20);
  std::string::~string(&stack0xffffffffffffff98);
  std::string::~string(local_28);
  std::string::~string(local_30);
  std::string::~string(local_60);
  std::string::~string(local_38);
  std::string::~string(local_40);
  std::string::~string(local_48);
  return __lhs;
}

Assistant:

string ToString() const {
    return "BlockInfo:: " + to_string(lba_) + ", " + to_string(addr_) + ", " +
           to_string(length_) + " " + datanode_info_.ToString();
  }